

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O1

int SUNPCGSetMaxl(SUNLinearSolver S,int maxl)

{
  int iVar1;
  
  if (S != (SUNLinearSolver)0x0) {
    iVar1 = 5;
    if (0 < maxl) {
      iVar1 = maxl;
    }
    *(int *)S->content = iVar1;
    return 0;
  }
  return -1;
}

Assistant:

SUNDIALS_EXPORT int SUNLinSol_PCGSetMaxl(SUNLinearSolver S, int maxl) 
{
  /* Check for non-NULL SUNLinearSolver */
  if (S == NULL) return(SUNLS_MEM_NULL);

  /* Check for legal pretype */ 
  if (maxl <= 0)
    maxl = SUNPCG_MAXL_DEFAULT;

  /* Set pretype */
  PCG_CONTENT(S)->maxl = maxl;
  return(SUNLS_SUCCESS);
}